

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void set_initial_lda_wrapper<dense_parameters>::func(weight *w,initial_weights *iw,uint64_t index)

{
  float fVar1;
  uint uVar2;
  undefined4 *in_RSI;
  long in_RDI;
  float fVar3;
  double dVar4;
  size_t i;
  weight *pw;
  weight initial_random;
  uint32_t lda;
  uint64_t *initial;
  
  uVar2 = in_RSI[3];
  fVar1 = (float)in_RSI[1];
  if ((*(byte *)(in_RSI + 2) & 1) != 0) {
    for (initial = (uint64_t *)0x0; initial != (uint64_t *)(ulong)uVar2;
        initial = (uint64_t *)((long)initial + 1)) {
      fVar3 = merand48(initial);
      dVar4 = log((double)fVar3 + 1e-06);
      *(float *)(in_RDI + (long)initial * 4) = (float)(-dVar4 + 1.0) * fVar1;
    }
  }
  *(undefined4 *)(in_RDI + (ulong)uVar2 * 4) = *in_RSI;
  return;
}

Assistant:

static void func(weight &w, initial_weights &iw, uint64_t index)
  {
    uint32_t lda = iw._lda;
    weight initial_random = iw._initial_random;
    if (iw._random)
    {
      weight *pw = &w;
      for (size_t i = 0; i != lda; ++i, ++index) pw[i] = (float)(-log(merand48(index) + 1e-6) + 1.0f) * initial_random;
    }
    (&w)[lda] = iw._initial;
  }